

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O0

bool __thiscall cert::World::intersects(World *this,Ray *r,float t_min,float t_max)

{
  uint uVar1;
  size_t sVar2;
  Shape **ppSVar3;
  int local_2c;
  bool hit;
  int i;
  float t_max_local;
  float t_min_local;
  Ray *r_local;
  World *this_local;
  
  local_2c = 0;
  while( true ) {
    sVar2 = DynamicArray<cert::Shape_*>::size(&this->shapes);
    if (sVar2 <= (ulong)(long)local_2c) {
      return false;
    }
    ppSVar3 = DynamicArray<cert::Shape_*>::at(&this->shapes,(long)local_2c);
    uVar1 = (*(*ppSVar3)->_vptr_Shape[2])(t_min,t_max,*ppSVar3,r);
    if ((uVar1 & 1) != 0) break;
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

constexpr bool intersects (const Ray& r, float t_min, float t_max) const
	{
		for (int i = 0; i < shapes.size (); i++)
		{
			bool hit = shapes.at (i)->intersects (r, t_min, t_max);
			if (hit) return true;
		}
		return false;
	}